

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int div;
  int nb;
  uint local_20;
  uint local_1c;
  
  printf("nb = ");
  __isoc99_scanf("%d",&local_1c);
  printf("div = ");
  __isoc99_scanf("%d",&local_20);
  if ((int)((long)(int)local_1c % (long)(int)local_20) == 0) {
    printf("The number %d is a multiple of %d as %d modulo %d equals 0\n",(ulong)local_1c,
           (ulong)local_20);
  }
  else {
    printf("The number %d is not a multiple of %d as %d modulo %d equals %d\n",(ulong)local_1c,
           (ulong)local_20,(ulong)local_1c,(ulong)local_20,
           (long)(int)local_1c % (long)(int)local_20 & 0xffffffff);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int nb, div;
  printf("nb = ");
  scanf("%d", &nb);
  printf("div = ");
  scanf("%d", &div);

  if (nb % div == 0) {
    printf("The number %d is a multiple of %d as %d modulo %d equals 0\n", nb, div, nb, div);
  } else {
    printf("The number %d is not a multiple of %d as %d modulo %d equals %d\n", nb, div, nb, div, nb % div);
  }

  return 0;
}